

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O0

void godvoice(aligntyp g_align,char *words)

{
  int iVar1;
  char *pcVar2;
  char *local_20;
  char *quot;
  char *words_local;
  aligntyp g_align_local;
  
  local_20 = "";
  if (words == (char *)0x0) {
    quot = "";
  }
  else {
    local_20 = "\"";
    quot = words;
  }
  pcVar2 = align_gname(g_align);
  iVar1 = rn2(4);
  pline("The voice of %s %s: %s%s%s",pcVar2,godvoices[iVar1],local_20,quot,local_20);
  return;
}

Assistant:

static void godvoice(aligntyp g_align, const char *words)
{
    const char *quot = "";
    if (words)
	quot = "\"";
    else
	words = "";

    pline("The voice of %s %s: %s%s%s", align_gname(g_align),
	  godvoices[rn2(SIZE(godvoices))], quot, words, quot);
}